

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::BuildLightsForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  uint uVar1;
  key_type *pkVar2;
  const_iterator cVar3;
  aiNode *this_00;
  Logger *this_01;
  key_type *__k;
  float __tmp;
  float fVar4;
  ai_real aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  aiLight *out;
  char *local_1c8 [4];
  aiNode *local_1a8 [47];
  
  pkVar2 = &((pNode->mLights).
             super__Vector_base<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish)->mLight;
  for (__k = &((pNode->mLights).
               super__Vector_base<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
               ._M_impl.super__Vector_impl_data._M_start)->mLight; __k != pkVar2; __k = __k + 1) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
            ::find(&(pParser->mLightLibrary)._M_t,__k);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(pParser->mLightLibrary)._M_t._M_impl.super__Rb_tree_header) {
      this_01 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [39])"Collada: Unable to find light for ID \"");
      std::operator<<((ostream *)local_1a8,(string *)__k);
      std::operator<<((ostream *)local_1a8,"\". Skipping.");
      std::__cxx11::stringbuf::str();
      Logger::warn(this_01,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    else {
      this_00 = (aiNode *)operator_new(0x46c);
      aiLight::aiLight((aiLight *)this_00);
      local_1a8[0] = this_00;
      if (this_00 != pTarget) {
        uVar1 = (pTarget->mName).length;
        (this_00->mName).length = uVar1;
        memcpy((this_00->mName).data,(pTarget->mName).data,(ulong)uVar1);
        (this_00->mName).data[uVar1] = '\0';
      }
      fVar7 = (float)cVar3._M_node[2]._M_color;
      (this_00->mTransformation).a1 = fVar7;
      (this_00->mTransformation).b1 = 0.0;
      (this_00->mTransformation).b2 = 0.0;
      (this_00->mTransformation).b3 = -1.0;
      (this_00->mTransformation).c3 = *(float *)&cVar3._M_node[2]._M_left;
      (this_00->mTransformation).c4 = *(float *)((long)&cVar3._M_node[2]._M_left + 4);
      (this_00->mTransformation).d1 = *(float *)&cVar3._M_node[2]._M_right;
      fVar4 = *(float *)((long)&cVar3._M_node[3]._M_parent + 4);
      fVar6 = *(float *)&cVar3._M_node[2].field_0x4 * fVar4;
      fVar8 = *(float *)&cVar3._M_node[2]._M_parent * fVar4;
      fVar4 = fVar4 * *(float *)((long)&cVar3._M_node[2]._M_parent + 4);
      ((aiColor3D *)&this_00->mNumChildren)->r = fVar6;
      *(float *)&this_00->field_0x454 = fVar8;
      *(float *)&this_00->mChildren = fVar4;
      ((aiColor3D *)&this_00->field_0x444)->r = fVar6;
      *(float *)&this_00->mParent = fVar8;
      *(float *)((long)&this_00->mParent + 4) = fVar4;
      ((aiColor3D *)&(this_00->mTransformation).d2)->r = fVar6;
      (this_00->mTransformation).d3 = fVar8;
      (this_00->mTransformation).d4 = fVar4;
      if (fVar7 == 5.60519e-45) {
        (this_00->mTransformation).d2 = 0.0;
        (this_00->mTransformation).d3 = 0.0;
        *(undefined8 *)&(this_00->mTransformation).d4 = 0;
        this_00->mParent = (aiNode *)0x0;
        fVar8 = *(float *)((long)&cVar3._M_node[3]._M_parent + 4);
        fVar4 = fVar8 * *(float *)&cVar3._M_node[2].field_0x4;
        fVar6 = *(float *)&cVar3._M_node[2]._M_parent * fVar8;
        aVar5 = fVar8 * *(float *)((long)&cVar3._M_node[2]._M_parent + 4);
      }
      else {
        fVar4 = *(float *)((long)&cVar3._M_node[3]._M_parent + 4);
        fVar6 = *(float *)&cVar3._M_node[2].field_0x4 * fVar4;
        fVar8 = *(float *)&cVar3._M_node[2]._M_parent * fVar4;
        fVar4 = fVar4 * *(float *)((long)&cVar3._M_node[2]._M_parent + 4);
        ((aiColor3D *)&this_00->field_0x444)->r = fVar6;
        *(float *)&this_00->mParent = fVar8;
        *(float *)((long)&this_00->mParent + 4) = fVar4;
        ((aiColor3D *)&(this_00->mTransformation).d2)->r = fVar6;
        (this_00->mTransformation).d3 = fVar8;
        (this_00->mTransformation).d4 = fVar4;
        fVar4 = 0.0;
        fVar6 = 0.0;
        aVar5 = 0.0;
      }
      this_00->mNumChildren = (uint)fVar4;
      *(float *)&this_00->field_0x454 = fVar6;
      *(ai_real *)&this_00->mChildren = aVar5;
      if (fVar7 == 4.2039e-45) {
        fVar4 = *(float *)((long)&cVar3._M_node[2]._M_right + 4) * 0.017453292;
        *(float *)((long)&this_00->mChildren + 4) = fVar4;
        if (9.99999e+08 <= *(float *)&cVar3._M_node[3]._M_parent) {
          if (9.99999e+08 <= *(float *)&cVar3._M_node[3].field_0x4) {
            fVar4 = powf(0.1,1.0 / (float)cVar3._M_node[3]._M_color);
            fVar4 = acosf(fVar4);
            local_1a8[0]->mNumMeshes =
                 (uint)(fVar4 + *(float *)((long)&local_1a8[0]->mChildren + 4));
          }
          else {
            fVar7 = *(float *)&cVar3._M_node[3].field_0x4 * 0.017453292 + fVar4;
            this_00->mNumMeshes = (uint)fVar7;
            if (fVar7 < fVar4) {
              *(float *)((long)&this_00->mChildren + 4) = fVar7;
              this_00->mNumMeshes = (uint)fVar4;
            }
          }
        }
        else {
          this_00->mNumMeshes = (uint)(*(float *)&cVar3._M_node[3]._M_parent * 0.017453292);
        }
      }
      std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back
                (&this->mLights,(value_type *)local_1a8);
    }
  }
  return;
}

Assistant:

void ColladaLoader::BuildLightsForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    for (const Collada::LightInstance& lid : pNode->mLights) {
        // find the referred light
        ColladaParser::LightLibrary::const_iterator srcLightIt = pParser.mLightLibrary.find(lid.mLight);
        if (srcLightIt == pParser.mLightLibrary.end()) {
            ASSIMP_LOG_WARN_F("Collada: Unable to find light for ID \"", lid.mLight, "\". Skipping.");
            continue;
        }
        const Collada::Light* srcLight = &srcLightIt->second;

        // now fill our ai data structure
        aiLight* out = new aiLight();
        out->mName = pTarget->mName;
        out->mType = (aiLightSourceType)srcLight->mType;

        // collada lights point in -Z by default, rest is specified in node transform
        out->mDirection = aiVector3D(0.f, 0.f, -1.f);

        out->mAttenuationConstant = srcLight->mAttConstant;
        out->mAttenuationLinear = srcLight->mAttLinear;
        out->mAttenuationQuadratic = srcLight->mAttQuadratic;

        out->mColorDiffuse = out->mColorSpecular = out->mColorAmbient = srcLight->mColor*srcLight->mIntensity;
        if (out->mType == aiLightSource_AMBIENT) {
            out->mColorDiffuse = out->mColorSpecular = aiColor3D(0, 0, 0);
            out->mColorAmbient = srcLight->mColor*srcLight->mIntensity;
        }
        else {
            // collada doesn't differentiate between these color types
            out->mColorDiffuse = out->mColorSpecular = srcLight->mColor*srcLight->mIntensity;
            out->mColorAmbient = aiColor3D(0, 0, 0);
        }

        // convert falloff angle and falloff exponent in our representation, if given
        if (out->mType == aiLightSource_SPOT) {
            out->mAngleInnerCone = AI_DEG_TO_RAD(srcLight->mFalloffAngle);

            // ... some extension magic.
            if (srcLight->mOuterAngle >= ASSIMP_COLLADA_LIGHT_ANGLE_NOT_SET * (1 - 1e-6f)) {
                // ... some deprecation magic.
                if (srcLight->mPenumbraAngle >= ASSIMP_COLLADA_LIGHT_ANGLE_NOT_SET * (1 - 1e-6f)) {
                    // Need to rely on falloff_exponent. I don't know how to interpret it, so I need to guess ....
                    // epsilon chosen to be 0.1
                    out->mAngleOuterCone = std::acos(std::pow(0.1f, 1.f / srcLight->mFalloffExponent)) +
                        out->mAngleInnerCone;
                }
                else {
                    out->mAngleOuterCone = out->mAngleInnerCone + AI_DEG_TO_RAD(srcLight->mPenumbraAngle);
                    if (out->mAngleOuterCone < out->mAngleInnerCone)
                        std::swap(out->mAngleInnerCone, out->mAngleOuterCone);
                }
            }
            else {
                out->mAngleOuterCone = AI_DEG_TO_RAD(srcLight->mOuterAngle);
            }
        }

        // add to light list
        mLights.push_back(out);
    }
}